

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFile.cpp
# Opt level: O1

bool __thiscall ObjectFile::startTransaction(ObjectFile *this,Access param_1)

{
  pointer pcVar1;
  bool bVar2;
  File *this_00;
  MutexLocker lock;
  MutexLocker local_48;
  string local_38;
  
  MutexLocker::MutexLocker(&local_48,this->objectMutex);
  if (this->inTransaction == false) {
    this_00 = (File *)operator_new(0x38);
    pcVar1 = (this->lockpath)._M_dataplus._M_p;
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_38,pcVar1,pcVar1 + (this->lockpath)._M_string_length);
    File::File(this_00,&local_38,this->umask,false,true,true,true);
    this->transactionLockFile = this_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    bVar2 = File::isValid(this->transactionLockFile);
    if (bVar2) {
      bVar2 = File::lock(this->transactionLockFile,true);
      if (bVar2) {
        this->inTransaction = true;
        bVar2 = true;
        goto LAB_00134de0;
      }
    }
    if (this->transactionLockFile != (File *)0x0) {
      (*this->transactionLockFile->_vptr_File[1])();
    }
    this->transactionLockFile = (File *)0x0;
    bVar2 = false;
    softHSMLog(3,"startTransaction",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
               ,0x310,"Failed to lock file %s for attribute transaction",
               (this->lockpath)._M_dataplus._M_p);
  }
  else {
    bVar2 = false;
  }
LAB_00134de0:
  MutexLocker::~MutexLocker(&local_48);
  return bVar2;
}

Assistant:

bool ObjectFile::startTransaction(Access)
{
	MutexLocker lock(objectMutex);

	if (inTransaction)
	{
		return false;
	}

	transactionLockFile = new File(lockpath, umask, false, true, true);

	if (!transactionLockFile->isValid() || !transactionLockFile->lock())
	{
		delete transactionLockFile;
		transactionLockFile = NULL;

		ERROR_MSG("Failed to lock file %s for attribute transaction", lockpath.c_str());

		return false;
	}

	inTransaction = true;

	return true;
}